

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

uint32_t uloc_getLCID_63(char *localeID)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  UErrorCode status;
  char tmpLocaleID [157];
  char collVal [96];
  char langID [157];
  UErrorCode local_1bc;
  char local_1b8 [160];
  char local_118 [96];
  char local_b8 [160];
  
  local_1bc = U_ZERO_ERROR;
  if (localeID == (char *)0x0) {
    return 0;
  }
  sVar4 = strlen(localeID);
  if (sVar4 < 2) {
    return 0;
  }
  uVar2 = uprv_convertToLCIDPlatform_63(localeID);
  if (uVar2 != 0) {
    return uVar2;
  }
  uloc_getLanguage_63(localeID,local_b8,0x9d,&local_1bc);
  uVar2 = 0;
  if (U_ZERO_ERROR < local_1bc) {
    return 0;
  }
  pcVar5 = strchr(localeID,0x40);
  if (pcVar5 == (char *)0x0) goto LAB_002dd6e2;
  uVar3 = uloc_getKeywordValue_63(localeID,"collation",local_118,0x5f,&local_1bc);
  if ((int)uVar3 < 1 || U_ZERO_ERROR < local_1bc) {
LAB_002dd6d4:
    local_1bc = U_ZERO_ERROR;
    bVar1 = true;
  }
  else {
    local_118[uVar3] = '\0';
    uVar3 = _canonicalize(localeID,local_1b8,0x9c,2,&local_1bc);
    if (((int)uVar3 < 1) || (U_ZERO_ERROR < local_1bc)) goto LAB_002dd6d4;
    local_1b8[uVar3] = '\0';
    uVar3 = uloc_setKeywordValue_63("collation",local_118,local_1b8,0x9c - uVar3,&local_1bc);
    if ((int)uVar3 < 1 || U_ZERO_ERROR < local_1bc) goto LAB_002dd6d4;
    local_1b8[uVar3] = '\0';
    uVar2 = uprv_convertToLCID_63(local_b8,local_1b8,&local_1bc);
    bVar1 = false;
  }
  if (!bVar1) {
    return uVar2;
  }
LAB_002dd6e2:
  uVar2 = uprv_convertToLCID_63(local_b8,localeID,&local_1bc);
  return uVar2;
}

Assistant:

U_CAPI uint32_t  U_EXPORT2
uloc_getLCID(const char* localeID)
{
    UErrorCode status = U_ZERO_ERROR;
    char       langID[ULOC_FULLNAME_CAPACITY];
    uint32_t   lcid = 0;

    /* Check for incomplete id. */
    if (!localeID || uprv_strlen(localeID) < 2) {
        return 0;
    }

    // Attempt platform lookup if available
    lcid = uprv_convertToLCIDPlatform(localeID);
    if (lcid > 0)
    {
        // Windows found an LCID, return that
        return lcid;
    }

    uloc_getLanguage(localeID, langID, sizeof(langID), &status);
    if (U_FAILURE(status)) {
        return 0;
    }

    if (uprv_strchr(localeID, '@')) {
        // uprv_convertToLCID does not support keywords other than collation.
        // Remove all keywords except collation.
        int32_t len;
        char collVal[ULOC_KEYWORDS_CAPACITY];
        char tmpLocaleID[ULOC_FULLNAME_CAPACITY];

        len = uloc_getKeywordValue(localeID, "collation", collVal,
            UPRV_LENGTHOF(collVal) - 1, &status);

        if (U_SUCCESS(status) && len > 0) {
            collVal[len] = 0;

            len = uloc_getBaseName(localeID, tmpLocaleID,
                UPRV_LENGTHOF(tmpLocaleID) - 1, &status);

            if (U_SUCCESS(status) && len > 0) {
                tmpLocaleID[len] = 0;

                len = uloc_setKeywordValue("collation", collVal, tmpLocaleID,
                    UPRV_LENGTHOF(tmpLocaleID) - len - 1, &status);

                if (U_SUCCESS(status) && len > 0) {
                    tmpLocaleID[len] = 0;
                    return uprv_convertToLCID(langID, tmpLocaleID, &status);
                }
            }
        }

        // fall through - all keywords are simply ignored
        status = U_ZERO_ERROR;
    }

    return uprv_convertToLCID(langID, localeID, &status);
}